

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

void __thiscall
QMainWindowLayout::insertToolBar(QMainWindowLayout *this,QToolBar *before,QToolBar *toolbar)

{
  bool bVar1;
  QLayoutItem *item_00;
  int *piVar2;
  QToolBar *in_RDX;
  QToolBarAreaLayout *in_RSI;
  QToolBarAreaLayout *in_RDI;
  long in_FS_OFFSET;
  QRect QVar3;
  QLayoutItem *item;
  QToolBarAreaLayout *this_00;
  undefined1 in_stack_ffffffffffffffd0 [16];
  QLayout *in_stack_ffffffffffffffe0;
  QToolBarAreaLayout *this_01;
  
  this_01 = *(QToolBarAreaLayout **)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  QLayout::addChildWidget(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd0._8_8_);
  item_00 = QToolBarAreaLayout::insertToolBar(this_00,(QToolBar *)in_RSI,in_RDX);
  bVar1 = QMainWindowLayoutState::isValid((QMainWindowLayoutState *)0x5f621b);
  if ((bVar1) && (item_00 != (QLayoutItem *)0x0)) {
    QToolBarAreaLayout::insertItem(in_RSI,in_RDX,item_00);
  }
  bVar1 = QList<int>::isEmpty((QList<int> *)0x5f6257);
  if ((!bVar1) && (piVar2 = QList<int>::constFirst((QList<int> *)item_00), *piVar2 == 0)) {
    QToolBarAreaLayout::currentGapIndex(this_01);
    QList<int>::operator=((QList<int> *)item_00,(QList<int> *)in_RDI);
    QList<int>::~QList((QList<int> *)0x5f62b0);
    bVar1 = QList<int>::isEmpty((QList<int> *)0x5f62c0);
    if (!bVar1) {
      QList<int>::prepend((QList<int> *)0x5f62d6,(parameter_type)((ulong)in_RDI >> 0x20));
      QVar3 = QMainWindowLayoutState::itemRect
                        (in_stack_ffffffffffffffd0._8_8_,in_stack_ffffffffffffffd0._0_8_);
      in_RDI[7].docks[3].lines.d.ptr = QVar3._0_8_;
      in_RDI[7].docks[3].lines.d.size = QVar3._8_8_;
    }
  }
  (**(code **)&((DataPointer *)&in_RDI->rect)->d[7].super_QArrayData)();
  if (*(QToolBarAreaLayout **)(in_FS_OFFSET + 0x28) != this_01) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMainWindowLayout::insertToolBar(QToolBar *before, QToolBar *toolbar)
{
    addChildWidget(toolbar);
    QLayoutItem *item = layoutState.toolBarAreaLayout.insertToolBar(before, toolbar);
    if (savedState.isValid() && item) {
        // copy the toolbar also in the saved state
        savedState.toolBarAreaLayout.insertItem(before, item);
    }
    if (!currentGapPos.isEmpty() && currentGapPos.constFirst() == 0) {
        currentGapPos = layoutState.toolBarAreaLayout.currentGapIndex();
        if (!currentGapPos.isEmpty()) {
            currentGapPos.prepend(0);
            currentGapRect = layoutState.itemRect(currentGapPos);
        }
    }
    invalidate();
}